

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

bool __thiscall Lexer::next(Lexer *this,Token req)

{
  _Elt_pointer pTVar1;
  _Elt_pointer pTVar2;
  _Elt_pointer pTVar3;
  _Map_pointer ppTVar4;
  bool bVar5;
  Token TVar6;
  size_type sVar7;
  _Self local_38;
  
  pTVar1 = (this->m_tokenPosition)._M_cur;
  pTVar2 = (this->m_tokenPosition)._M_first;
  pTVar3 = (this->m_tokenPosition)._M_last;
  ppTVar4 = (this->m_tokenPosition)._M_node;
  bVar5 = List<Lexer::TokenInfo>::isEmpty(&this->m_tokens);
  if ((!bVar5) &&
     (sVar7 = std::deque<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>::size
                        ((deque<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_> *)this),
     (int)sVar7 != 1)) {
    std::_Deque_iterator<Lexer::TokenInfo,_Lexer::TokenInfo_&,_Lexer::TokenInfo_*>::operator++
              (&local_38,&this->m_tokenPosition,0);
    if ((this->m_tokenPosition)._M_cur !=
        (this->m_tokens)._deque.
        super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur) {
      if (req == Any) {
        return true;
      }
      TVar6 = tokenType(this);
      if (TVar6 == req) {
        return true;
      }
    }
    (this->m_tokenPosition)._M_cur = pTVar1;
    (this->m_tokenPosition)._M_first = pTVar2;
    (this->m_tokenPosition)._M_last = pTVar3;
    (this->m_tokenPosition)._M_node = ppTVar4;
  }
  return false;
}

Assistant:

bool Lexer::next (Token req)
{
	Iterator pos = m_tokenPosition;

	if (m_tokens.isEmpty() || m_tokens.size() == 1) // is 1 due to extra dummy token in the beginning
		return false;

	m_tokenPosition++;

	if (isAtEnd() or (req !=Token::Any and tokenType() != req))
	{
		m_tokenPosition = pos;
		return false;
	}

	return true;
}